

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::GcCompactTransientMiscBuffers(void)

{
  ImGuiContext *g;
  
  ImVector<int>::clear((ImVector<int> *)g);
  ImVector<ImGuiGroupData>::clear((ImVector<ImGuiGroupData> *)g);
  TableGcCompactSettings();
  return;
}

Assistant:

void ImGui::GcCompactTransientMiscBuffers()
{
    ImGuiContext& g = *GImGui;
    g.ItemFlagsStack.clear();
    g.GroupStack.clear();
    TableGcCompactSettings();
}